

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sopr.cc
# Opt level: O2

void anon_unknown.dwarf_3ecb::PrintTypeErrorMessage(char *option)

{
  ostream *poVar1;
  ostringstream error_message;
  allocator local_1a9;
  string local_1a8;
  ostringstream local_188 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_188);
  poVar1 = std::operator<<((ostream *)local_188,"The argument for the -");
  poVar1 = std::operator<<(poVar1,option);
  std::operator<<(poVar1," option must be numeric");
  std::__cxx11::string::string((string *)&local_1a8,"sopr",&local_1a9);
  sptk::PrintErrorMessage(&local_1a8,(ostringstream *)local_188);
  std::__cxx11::string::~string((string *)&local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_188);
  return;
}

Assistant:

void PrintTypeErrorMessage(const char* option) {
  std::ostringstream error_message;
  error_message << "The argument for the -" << option
                << " option must be numeric";
  sptk::PrintErrorMessage("sopr", error_message);
}